

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::MockExceptionCallback::flush(MockExceptionCallback *this)

{
  reference pcVar1;
  size_type sVar2;
  ssize_t sVar3;
  int *piVar4;
  ssize_t n;
  char *end;
  reference local_18;
  char *pos;
  MockExceptionCallback *this_local;
  
  if (this->outputPipe != -1) {
    pos = (char *)this;
    end = (char *)::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::begin(&this->text);
    pcVar1 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&end);
    local_18 = pcVar1;
    sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&this->text);
    do {
      while( true ) {
        if (pcVar1 + sVar2 <= local_18) goto LAB_002708fb;
        sVar3 = write(this->outputPipe,local_18,(long)(pcVar1 + sVar2) - (long)local_18);
        if (sVar3 < 0) break;
        local_18 = local_18 + sVar3;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
LAB_002708fb:
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              (&this->text);
  }
  return;
}

Assistant:

void flush() {
    if (outputPipe != -1) {
      const char* pos = &*text.begin();
      const char* end = pos + text.size();

      while (pos < end) {
        miniposix::ssize_t n = miniposix::write(outputPipe, pos, end - pos);
        if (n < 0) {
          if (errno == EINTR) {
            continue;
          } else {
            break;  // Give up on error.
          }
        }
        pos += n;
      }

      text.clear();
    }
  }